

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall wabt::anon_unknown_77::BinaryReaderIR::OnCatchExpr(BinaryReaderIR *this)

{
  Result RVar1;
  reference base;
  TryExpr *pTVar2;
  Enum EVar3;
  LabelNode *parent_label;
  LabelNode *label;
  
  RVar1 = TopLabel(this,&label);
  EVar3 = Error;
  if (RVar1.enum_ != Error) {
    if (label->label_type == Try) {
      RVar1 = GetLabelAt(this,&parent_label,1);
      if (RVar1.enum_ != Error) {
        label->label_type = Catch;
        base = intrusive_list<wabt::Expr>::back(parent_label->exprs);
        pTVar2 = cast<wabt::TryExpr,wabt::Expr>(base);
        label->exprs = &pTVar2->catch_;
        EVar3 = Ok;
      }
    }
    else {
      PrintError(this,"catch expression without matching try");
    }
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderIR::OnCatchExpr() {
  LabelNode* label;
  CHECK_RESULT(TopLabel(&label));
  if (label->label_type != LabelType::Try) {
    PrintError("catch expression without matching try");
    return Result::Error;
  }

  LabelNode* parent_label;
  CHECK_RESULT(GetLabelAt(&parent_label, 1));

  label->label_type = LabelType::Catch;
  label->exprs = &cast<TryExpr>(&parent_label->exprs->back())->catch_;
  return Result::Ok;
}